

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# interpreter_test.cpp
# Opt level: O0

void __thiscall
InterpreterTestSuite_PC_BrAddInterObjectInconsistencyFail_Test::
InterpreterTestSuite_PC_BrAddInterObjectInconsistencyFail_Test
          (InterpreterTestSuite_PC_BrAddInterObjectInconsistencyFail_Test *this)

{
  InterpreterTestSuite_PC_BrAddInterObjectInconsistencyFail_Test *this_local;
  
  InterpreterTestSuite::InterpreterTestSuite(&this->super_InterpreterTestSuite);
  (this->super_InterpreterTestSuite).super_Test._vptr_Test =
       (_func_int **)&PTR__InterpreterTestSuite_PC_BrAddInterObjectInconsistencyFail_Test_005b59f0;
  return;
}

Assistant:

TEST_F(InterpreterTestSuite, PC_BrAddInterObjectInconsistencyFail)
{
    TestContext ctx;
    InitContext(ctx);

    std::string brJsonSameAddr                  = "[\n\
    {\n\
        \"Addr\": \"1234::5678\",\n\
        \"Port\": 2000,\n\
        \"ThreadVersion\": \"th1.2\",\n\
        \"State\": 0,\n\
    },\n\
    {\n\
        \"Addr\": \"1234::5678\",\n\
        \"Port\": 2000,\n\
        \"ThreadVersion\": \"th1.2\",\n\
        \"State\": 0,\n\
    }\n\
]";
    std::string brJsonSameXPanDifferentNwkNames = "[\n\
    {\n\
        \"Addr\": \"1234::5678\",\n\
        \"Port\": 2000,\n\
        \"ThreadVersion\": \"th1.2\",\n\
        \"State\": 0,\n\
        \"NetworkName\": \"net1\",\n\
        \"ExtendedPanId\": 1234,\n\
     },\n\
    {\n\
        \"Addr\": \"1234::5679\",\n\
        \"Port\": 2000,\n\
        \"ThreadVersion\": \"th1.2\",\n\
        \"State\": 0,\n\
        \"NetworkName\": \"net2\",\n\
        \"ExtendedPanId\": 1234,\n\
    }\n\
]";
    std::string brJsonSameXPanDifferentDomains  = "[\n\
    {\n\
        \"Addr\": \"1234::5678\",\n\
        \"Port\": 2000,\n\
        \"ThreadVersion\": \"th1.2\",\n\
        \"State\": 0,\n\
        \"ExtendedPanId\": 1234,\n\
        \"NetworkName\": \"net2\",\n\
        \"DomainName\": \"dom1\"\n\
    },\n\
    {\n\
        \"Addr\": \"1234::5679\",\n\
        \"Port\": 2000,\n\
        \"ThreadVersion\": \"th1.2\",\n\
        \"State\": 0,\n\
        \"NetworkName\": \"net2\",\n\
        \"ExtendedPanId\": 1234,\n\
        \"DomainName\": \"dom2\"\n\
    }\n\
]";

    Interpreter::Expression expr;
    Interpreter::Value      value;

    EXPECT_EQ(WriteFile(brJsonSameAddr, "./tmp/json.json"), Error{});
    expr  = ctx.mInterpreter.ParseExpression("br add ./tmp/json.json");
    value = ctx.mInterpreter.Eval(expr);
    EXPECT_FALSE(value.HasNoError());

    EXPECT_EQ(WriteFile(brJsonSameXPanDifferentNwkNames, "./tmp/json.json"), Error{});
    expr  = ctx.mInterpreter.ParseExpression("br add ./tmp/json.json");
    value = ctx.mInterpreter.Eval(expr);
    EXPECT_FALSE(value.HasNoError());

    EXPECT_EQ(WriteFile(brJsonSameXPanDifferentDomains, "./tmp/json.json"), Error{});
    expr  = ctx.mInterpreter.ParseExpression("br add ./tmp/json.json");
    value = ctx.mInterpreter.Eval(expr);
    EXPECT_FALSE(value.HasNoError());
}